

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_sse42_intr.c
# Opt level: O2

void ihevcd_itrans_recon_dc_luma_sse42
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  __m128i *pi4_dst;
  undefined6 in_register_0000008a;
  WORD32 i;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 in_XMM1 [16];
  short sVar14;
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  short sVar23;
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  
  iVar4 = 1;
  iVar5 = 1 << ((byte)log2_trans_size & 0x1f);
  auVar6 = ZEXT416(((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40U >> 1) + 0x800
                   >> 0xc);
  auVar6 = pshuflw(auVar6,auVar6,0);
  sVar22 = auVar6._0_2_;
  sVar23 = auVar6._2_2_;
  if (log2_trans_size == 2) {
    uVar1 = *(undefined8 *)pu1_pred;
    lVar3 = (long)pred_strd;
    auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar16._0_8_ = uVar1;
    auVar16._12_4_ = (int)((ulong)*(undefined8 *)(pu1_pred + lVar3) >> 0x20);
    auVar6._8_8_ = auVar16._8_8_;
    auVar6._0_4_ = (undefined4)uVar1;
    auVar6._4_4_ = (int)*(undefined8 *)(pu1_pred + lVar3);
    uVar1 = *(undefined8 *)(pu1_pred + lVar3 * 2);
    auVar25._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar25._0_8_ = uVar1;
    auVar25._12_4_ = (int)((ulong)*(undefined8 *)(pu1_pred + lVar3 * 3) >> 0x20);
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._0_4_ = (undefined4)uVar1;
    auVar24._4_4_ = (int)*(undefined8 *)(pu1_pred + lVar3 * 3);
    auVar6 = pmovzxbw(auVar6,auVar6);
    auVar16 = pmovzxbw(auVar24,auVar24);
    sVar7 = auVar6._0_2_ + sVar22;
    sVar8 = auVar6._2_2_ + sVar23;
    sVar9 = auVar6._4_2_ + sVar22;
    sVar10 = auVar6._6_2_ + sVar23;
    sVar11 = auVar6._8_2_ + sVar22;
    sVar12 = auVar6._10_2_ + sVar23;
    sVar13 = auVar6._12_2_ + sVar22;
    sVar14 = auVar6._14_2_ + sVar23;
    sVar15 = auVar16._0_2_ + sVar22;
    sVar17 = auVar16._2_2_ + sVar23;
    sVar18 = auVar16._4_2_ + sVar22;
    sVar19 = auVar16._6_2_ + sVar23;
    sVar20 = auVar16._8_2_ + sVar22;
    sVar21 = auVar16._10_2_ + sVar23;
    sVar22 = auVar16._12_2_ + sVar22;
    sVar23 = auVar16._14_2_ + sVar23;
    *pu1_dst = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    pu1_dst[1] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    pu1_dst[2] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    pu1_dst[3] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    lVar2 = (long)dst_strd;
    pu1_dst[lVar2 + 4] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    pu1_dst[lVar2 + 5] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    pu1_dst[lVar2 + 6] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    pu1_dst[lVar2 + 7] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    lVar3 = lVar2 * 2;
    pu1_dst[lVar3 + 8] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    pu1_dst[lVar3 + 9] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    pu1_dst[lVar3 + 10] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    pu1_dst[lVar3 + 0xb] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    lVar2 = lVar2 * 3;
    pu1_dst[lVar2 + 0xc] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    pu1_dst[lVar2 + 0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    pu1_dst[lVar2 + 0xe] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    pu1_dst[lVar2 + 0xf] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    return;
  }
  for (; iVar4 <= iVar5; iVar4 = iVar4 + 4) {
    for (lVar3 = 0; (int)lVar3 + 1 <= iVar5; lVar3 = lVar3 + 8) {
      auVar6 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_pred + lVar3));
      auVar16 = pmovzxbw(in_XMM2,*(undefined8 *)(pu1_pred + lVar3 + pred_strd));
      auVar24 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_pred + lVar3 + pred_strd * 2));
      auVar25 = pmovzxbw(in_XMM4,*(undefined8 *)(pu1_pred + lVar3 + pred_strd * 3));
      sVar7 = auVar6._0_2_ + sVar22;
      sVar8 = auVar6._2_2_ + sVar23;
      sVar9 = auVar6._4_2_ + sVar22;
      sVar10 = auVar6._6_2_ + sVar23;
      sVar11 = auVar6._8_2_ + sVar22;
      sVar12 = auVar6._10_2_ + sVar23;
      sVar13 = auVar6._12_2_ + sVar22;
      sVar14 = auVar6._14_2_ + sVar23;
      in_XMM2._0_2_ = auVar16._0_2_ + sVar22;
      in_XMM2._2_2_ = auVar16._2_2_ + sVar23;
      in_XMM2._4_2_ = auVar16._4_2_ + sVar22;
      in_XMM2._6_2_ = auVar16._6_2_ + sVar23;
      in_XMM2._8_2_ = auVar16._8_2_ + sVar22;
      in_XMM2._10_2_ = auVar16._10_2_ + sVar23;
      in_XMM2._12_2_ = auVar16._12_2_ + sVar22;
      in_XMM2._14_2_ = auVar16._14_2_ + sVar23;
      in_XMM1._0_8_ =
           CONCAT17((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14),
                    CONCAT16((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                             CONCAT15((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 -
                                      (0xff < sVar12),
                                      CONCAT14((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 -
                                               (0xff < sVar11),
                                               CONCAT13((0 < sVar10) * (sVar10 < 0x100) *
                                                        (char)sVar10 - (0xff < sVar10),
                                                        CONCAT12((0 < sVar9) * (sVar9 < 0x100) *
                                                                 (char)sVar9 - (0xff < sVar9),
                                                                 CONCAT11((0 < sVar8) *
                                                                          (sVar8 < 0x100) *
                                                                          (char)sVar8 -
                                                                          (0xff < sVar8),
                                                                          (0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          (char)sVar7 -
                                                                          (0xff < sVar7))))))));
      in_XMM1[8] = (0 < in_XMM2._0_2_) * (in_XMM2._0_2_ < 0x100) * (char)in_XMM2._0_2_ -
                   (0xff < in_XMM2._0_2_);
      in_XMM1[9] = (0 < in_XMM2._2_2_) * (in_XMM2._2_2_ < 0x100) * (char)in_XMM2._2_2_ -
                   (0xff < in_XMM2._2_2_);
      in_XMM1[10] = (0 < in_XMM2._4_2_) * (in_XMM2._4_2_ < 0x100) * (char)in_XMM2._4_2_ -
                    (0xff < in_XMM2._4_2_);
      in_XMM1[0xb] = (0 < in_XMM2._6_2_) * (in_XMM2._6_2_ < 0x100) * (char)in_XMM2._6_2_ -
                     (0xff < in_XMM2._6_2_);
      in_XMM1[0xc] = (0 < in_XMM2._8_2_) * (in_XMM2._8_2_ < 0x100) * (char)in_XMM2._8_2_ -
                     (0xff < in_XMM2._8_2_);
      in_XMM1[0xd] = (0 < in_XMM2._10_2_) * (in_XMM2._10_2_ < 0x100) * (char)in_XMM2._10_2_ -
                     (0xff < in_XMM2._10_2_);
      in_XMM1[0xe] = (0 < in_XMM2._12_2_) * (in_XMM2._12_2_ < 0x100) * (char)in_XMM2._12_2_ -
                     (0xff < in_XMM2._12_2_);
      in_XMM1[0xf] = (0 < in_XMM2._14_2_) * (in_XMM2._14_2_ < 0x100) * (char)in_XMM2._14_2_ -
                     (0xff < in_XMM2._14_2_);
      *(undefined8 *)(pu1_dst + lVar3) = in_XMM1._0_8_;
      *(long *)(pu1_dst + lVar3 + dst_strd) = in_XMM1._8_8_;
      sVar7 = auVar24._0_2_ + sVar22;
      sVar8 = auVar24._2_2_ + sVar23;
      sVar9 = auVar24._4_2_ + sVar22;
      sVar10 = auVar24._6_2_ + sVar23;
      sVar11 = auVar24._8_2_ + sVar22;
      sVar12 = auVar24._10_2_ + sVar23;
      sVar13 = auVar24._12_2_ + sVar22;
      sVar14 = auVar24._14_2_ + sVar23;
      in_XMM4._0_2_ = auVar25._0_2_ + sVar22;
      in_XMM4._2_2_ = auVar25._2_2_ + sVar23;
      in_XMM4._4_2_ = auVar25._4_2_ + sVar22;
      in_XMM4._6_2_ = auVar25._6_2_ + sVar23;
      in_XMM4._8_2_ = auVar25._8_2_ + sVar22;
      in_XMM4._10_2_ = auVar25._10_2_ + sVar23;
      in_XMM4._12_2_ = auVar25._12_2_ + sVar22;
      in_XMM4._14_2_ = auVar25._14_2_ + sVar23;
      in_XMM3._0_8_ =
           CONCAT17((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14),
                    CONCAT16((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                             CONCAT15((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 -
                                      (0xff < sVar12),
                                      CONCAT14((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 -
                                               (0xff < sVar11),
                                               CONCAT13((0 < sVar10) * (sVar10 < 0x100) *
                                                        (char)sVar10 - (0xff < sVar10),
                                                        CONCAT12((0 < sVar9) * (sVar9 < 0x100) *
                                                                 (char)sVar9 - (0xff < sVar9),
                                                                 CONCAT11((0 < sVar8) *
                                                                          (sVar8 < 0x100) *
                                                                          (char)sVar8 -
                                                                          (0xff < sVar8),
                                                                          (0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          (char)sVar7 -
                                                                          (0xff < sVar7))))))));
      in_XMM3[8] = (0 < in_XMM4._0_2_) * (in_XMM4._0_2_ < 0x100) * (char)in_XMM4._0_2_ -
                   (0xff < in_XMM4._0_2_);
      in_XMM3[9] = (0 < in_XMM4._2_2_) * (in_XMM4._2_2_ < 0x100) * (char)in_XMM4._2_2_ -
                   (0xff < in_XMM4._2_2_);
      in_XMM3[10] = (0 < in_XMM4._4_2_) * (in_XMM4._4_2_ < 0x100) * (char)in_XMM4._4_2_ -
                    (0xff < in_XMM4._4_2_);
      in_XMM3[0xb] = (0 < in_XMM4._6_2_) * (in_XMM4._6_2_ < 0x100) * (char)in_XMM4._6_2_ -
                     (0xff < in_XMM4._6_2_);
      in_XMM3[0xc] = (0 < in_XMM4._8_2_) * (in_XMM4._8_2_ < 0x100) * (char)in_XMM4._8_2_ -
                     (0xff < in_XMM4._8_2_);
      in_XMM3[0xd] = (0 < in_XMM4._10_2_) * (in_XMM4._10_2_ < 0x100) * (char)in_XMM4._10_2_ -
                     (0xff < in_XMM4._10_2_);
      in_XMM3[0xe] = (0 < in_XMM4._12_2_) * (in_XMM4._12_2_ < 0x100) * (char)in_XMM4._12_2_ -
                     (0xff < in_XMM4._12_2_);
      in_XMM3[0xf] = (0 < in_XMM4._14_2_) * (in_XMM4._14_2_ < 0x100) * (char)in_XMM4._14_2_ -
                     (0xff < in_XMM4._14_2_);
      *(undefined8 *)(pu1_dst + lVar3 + dst_strd * 2) = in_XMM3._0_8_;
      *(long *)(pu1_dst + lVar3 + dst_strd * 3) = in_XMM3._8_8_;
    }
    pu1_pred = pu1_pred + lVar3 + (pred_strd * 4 - iVar5);
    pu1_dst = pu1_dst + lVar3 + (dst_strd * 4 - iVar5);
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_luma_sse42(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                       WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    //WORD32 row,col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;




    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        WORD32 *pi4_dst = (WORD32 *)pu1_dst;

        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_4 = _mm_unpacklo_epi32(m_temp_reg_0, m_temp_reg_1);
        m_temp_reg_5 = _mm_unpacklo_epi32(m_temp_reg_2, m_temp_reg_3);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);


        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_8);
        m_temp_reg_1 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_2 = _mm_srli_si128(m_temp_reg_8, 8);
        m_temp_reg_3 = _mm_srli_si128(m_temp_reg_8, 12);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
    }
    else
    {
        WORD32 i, j;

        for(i = 1; i <= trans_size; i += 4)
        {
            for(j = 1; j <= trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));


                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_0, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_1, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_2, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_3, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);

                pi4_dst = (__m128i *)(pu1_dst);

                m_temp_reg_12 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                _mm_storel_epi64(pi4_dst, m_temp_reg_12);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                m_temp_reg_13 = _mm_srli_si128(m_temp_reg_12, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_13);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                m_temp_reg_14 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);
                _mm_storel_epi64(pi4_dst, m_temp_reg_14);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                m_temp_reg_15 = _mm_srli_si128(m_temp_reg_14, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_15);

                pu1_pred += 8;
                pu1_dst += 8;
            }
            pu1_pred += 4 * pred_strd - trans_size;
            pu1_dst += 4 * dst_strd - trans_size;
        }
    }


}